

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool iDynTree::isDOFBerdyDynamicVariable(BerdyDynamicVariablesTypes dynamicVariableType)

{
  BerdyDynamicVariablesTypes dynamicVariableType_local;
  bool local_1;
  
  switch(dynamicVariableType) {
  case LINK_BODY_PROPER_ACCELERATION:
    local_1 = false;
    break;
  case NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV:
    local_1 = false;
    break;
  case JOINT_WRENCH:
    local_1 = false;
    break;
  case DOF_TORQUE:
    local_1 = true;
    break;
  case NET_EXT_WRENCH:
    local_1 = false;
    break;
  case DOF_ACCELERATION:
    local_1 = true;
    break;
  case LINK_BODY_PROPER_CLASSICAL_ACCELERATION:
    local_1 = false;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isDOFBerdyDynamicVariable(const BerdyDynamicVariablesTypes dynamicVariableType)
{
    switch(dynamicVariableType)
    {
        case LINK_BODY_PROPER_ACCELERATION:
            return false;
        case NET_INT_AND_EXT_WRENCHES_ON_LINK_WITHOUT_GRAV:
            return false;
        case JOINT_WRENCH:
            return false;
        case DOF_TORQUE:
            return true;
        case NET_EXT_WRENCH:
            return false;
        case DOF_ACCELERATION:
            return true;
        case LINK_BODY_PROPER_CLASSICAL_ACCELERATION:
            return false;
        default:
            return false;
    }
}